

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-context.cpp
# Opt level: O0

llm_graph_result_ptr __thiscall
llama_context::graph_build
          (llama_context *this,ggml_context *ctx,ggml_cgraph *gf,llama_ubatch *ubatch,
          llm_graph_type gtype)

{
  llama_context *in_RSI;
  _Head_base<0UL,_llm_graph_result_i_*,_false> in_RDI;
  llm_graph_type in_stack_00000124;
  ggml_cgraph *in_stack_00000128;
  llm_graph_params *in_stack_00000130;
  llama_model *in_stack_00000138;
  undefined1 local_b8 [40];
  llm_arch local_90;
  llama_hparams *local_88;
  llama_cparams *local_80;
  pointer local_70;
  ggml_backend_t local_68;
  llama_adapter_cvec *local_60;
  llama_adapter_loras *local_58;
  pointer local_50;
  llama_cross *local_48;
  int32_t local_40;
  undefined1 *local_38;
  
  local_90 = in_RSI->model->arch;
  local_88 = &in_RSI->model->hparams;
  local_80 = &in_RSI->cparams;
  local_70 = std::unique_ptr<ggml_backend_sched,_ggml_backend_sched_deleter>::get
                       ((unique_ptr<ggml_backend_sched,_ggml_backend_sched_deleter> *)
                        in_RDI._M_head_impl);
  local_68 = in_RSI->backend_cpu;
  local_60 = &in_RSI->cvec;
  local_58 = &in_RSI->loras;
  local_50 = std::unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>::
             get((unique_ptr<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_> *
                 )in_RDI._M_head_impl);
  local_48 = &in_RSI->cross;
  local_40 = in_RSI->n_outputs;
  graph_get_cb(in_RSI);
  local_38 = local_b8;
  llama_model::build_graph(in_stack_00000138,in_stack_00000130,in_stack_00000128,in_stack_00000124);
  std::function<void_(const_llama_ubatch_&,_ggml_tensor_*,_const_char_*,_int)>::~function
            ((function<void_(const_llama_ubatch_&,_ggml_tensor_*,_const_char_*,_int)> *)0x3d9333);
  return (__uniq_ptr_data<llm_graph_result_i,_std::default_delete<llm_graph_result_i>,_true,_true>)
         (tuple<llm_graph_result_i_*,_std::default_delete<llm_graph_result_i>_>)in_RDI._M_head_impl;
}

Assistant:

llm_graph_result_ptr llama_context::graph_build(
            ggml_context * ctx,
             ggml_cgraph * gf,
      const llama_ubatch & ubatch,
            llm_graph_type gtype) {
    return model.build_graph(
            {
                /*.ctx         =*/ ctx,
                /*.arch        =*/ model.arch,
                /*.hparams     =*/ model.hparams,
                /*.cparams     =*/ cparams,
                /*.ubatch      =*/ ubatch,
                /*.sched       =*/ sched.get(),
                /*.backend_cpu =*/ backend_cpu,
                /*.cvec        =*/ &cvec,
                /*.loras       =*/ &loras,
                /*.memory      =*/ kv_self.get(),
                /*.cross       =*/ &cross,
                /*.n_outputs   =*/ n_outputs,
                /*.cb          =*/ graph_get_cb(),
            }, gf, gtype);
}